

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling.c
# Opt level: O3

void UpsampleRgba4444LinePair_C
               (uint8_t *top_y,uint8_t *bottom_y,uint8_t *top_u,uint8_t *top_v,uint8_t *cur_u,
               uint8_t *cur_v,uint8_t *top_dst,uint8_t *bottom_dst,int len)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  
  lVar15 = (long)len - 1;
  uVar3 = (int)lVar15 >> 1;
  uVar4 = (uint)*top_v << 0x10 | (uint)*top_u;
  uVar19 = (uint)*cur_v << 0x10 | (uint)*cur_u;
  uVar12 = uVar4 * 3 + uVar19 + 0x20002;
  uVar13 = uVar12 >> 0x12;
  uVar8 = (uint)*top_y * 0x4a85 >> 8;
  uVar16 = (uVar13 * 0x6625 >> 8) + uVar8;
  bVar2 = 0;
  uVar17 = uVar16 - 0x379a;
  bVar6 = 0xf0;
  if (uVar16 < 0x379a) {
    bVar6 = bVar2;
  }
  bVar1 = (byte)(uVar17 >> 6);
  if (0x3fff < uVar17) {
    bVar1 = bVar6;
  }
  uVar16 = uVar12 >> 2 & 0xff;
  iVar14 = (uVar13 * 0x3408 >> 8) + (uVar16 * 0x1913 >> 8);
  uVar12 = (uVar8 - iVar14) + 0x2204;
  bVar6 = 0xf;
  if ((int)(uVar8 - iVar14) < -0x2204) {
    bVar6 = bVar2;
  }
  if (uVar12 < 0x4000) {
    bVar6 = (byte)(uVar12 >> 10);
  }
  uVar8 = (uVar16 * 0x811a >> 8) + uVar8;
  uVar12 = uVar8 - 0x4515;
  *top_dst = bVar1 & 0xf0 | bVar6;
  bVar6 = (uVar8 < 0x4515) * '\x10' - 0x10;
  if (uVar12 < 0x4000) {
    bVar6 = (byte)(uVar12 >> 6);
  }
  top_dst[1] = bVar6 | 0xf;
  if (bottom_y != (uint8_t *)0x0) {
    uVar16 = uVar4 + uVar19 * 3 + 0x20002;
    uVar17 = uVar16 >> 0x12;
    uVar8 = (uint)*bottom_y * 0x4a85 >> 8;
    uVar12 = (uVar17 * 0x6625 >> 8) + uVar8;
    uVar13 = uVar12 - 0x379a;
    bVar6 = 0xf0;
    if (uVar12 < 0x379a) {
      bVar6 = bVar2;
    }
    bVar1 = (byte)(uVar13 >> 6);
    if (0x3fff < uVar13) {
      bVar1 = bVar6;
    }
    uVar12 = uVar16 >> 2 & 0xff;
    iVar14 = (uVar17 * 0x3408 >> 8) + (uVar12 * 0x1913 >> 8);
    uVar13 = (uVar8 - iVar14) + 0x2204;
    bVar6 = 0xf;
    if ((int)(uVar8 - iVar14) < -0x2204) {
      bVar6 = bVar2;
    }
    if (uVar13 < 0x4000) {
      bVar6 = (byte)(uVar13 >> 10);
    }
    uVar8 = (uVar12 * 0x811a >> 8) + uVar8;
    uVar12 = uVar8 - 0x4515;
    *bottom_dst = bVar1 & 0xf0 | bVar6;
    bVar6 = (uVar8 < 0x4515) * '\x10' - 0x10;
    if (uVar12 < 0x4000) {
      bVar6 = (byte)(uVar12 >> 6);
    }
    bottom_dst[1] = bVar6 | 0xf;
  }
  if (0 < (int)uVar3) {
    uVar20 = 0;
    uVar8 = uVar19;
    uVar12 = uVar4;
    do {
      uVar4 = (uint)top_v[uVar20 + 1] << 0x10 | (uint)top_u[uVar20 + 1];
      uVar19 = (uint)cur_v[uVar20 + 1] << 0x10 | (uint)cur_u[uVar20 + 1];
      iVar14 = uVar8 + uVar12 + uVar4 + uVar19;
      uVar16 = iVar14 + (uVar4 + uVar8) * 2 + 0x80008 >> 3;
      uVar7 = iVar14 + (uVar19 + uVar12) * 2 + 0x80008 >> 3;
      uVar12 = uVar12 + uVar16;
      uVar17 = uVar7 + uVar4;
      uVar18 = uVar12 >> 1 & 0xff;
      uVar12 = uVar12 >> 0x11;
      uVar13 = (uint)top_y[uVar20 * 2 + 1] * 0x4a85 >> 8;
      uVar9 = (uVar12 * 0x6625 >> 8) + uVar13;
      uVar10 = uVar9 - 0x379a;
      bVar6 = 0xf0;
      if (uVar9 < 0x379a) {
        bVar6 = 0;
      }
      bVar2 = (byte)(uVar10 >> 6);
      if (0x3fff < uVar10) {
        bVar2 = bVar6;
      }
      iVar14 = uVar13 - ((uVar12 * 0x3408 >> 8) + (uVar18 * 0x1913 >> 8));
      uVar12 = iVar14 + 0x2204;
      bVar6 = 0xf;
      if (iVar14 < -0x2204) {
        bVar6 = 0;
      }
      if (uVar12 < 0x4000) {
        bVar6 = (byte)(uVar12 >> 10);
      }
      uVar13 = (uVar18 * 0x811a >> 8) + uVar13;
      uVar12 = uVar13 - 0x4515;
      top_dst[uVar20 * 4 + 2] = bVar2 & 0xf0 | bVar6;
      bVar6 = (uVar13 < 0x4515) * '\x10' - 0x10;
      if (uVar12 < 0x4000) {
        bVar6 = (byte)(uVar12 >> 6);
      }
      top_dst[uVar20 * 4 + 3] = bVar6 | 0xf;
      uVar12 = uVar17 >> 1 & 0xff;
      uVar17 = uVar17 >> 0x11;
      uVar13 = (uint)top_y[uVar20 * 2 + 2] * 0x4a85 >> 8;
      uVar9 = (uVar17 * 0x6625 >> 8) + uVar13;
      uVar10 = uVar9 - 0x379a;
      bVar6 = 0xf0;
      if (uVar9 < 0x379a) {
        bVar6 = 0;
      }
      bVar2 = (byte)(uVar10 >> 6);
      if (0x3fff < uVar10) {
        bVar2 = bVar6;
      }
      iVar14 = uVar13 - ((uVar17 * 0x3408 >> 8) + (uVar12 * 0x1913 >> 8));
      uVar17 = iVar14 + 0x2204;
      bVar6 = 0xf;
      if (iVar14 < -0x2204) {
        bVar6 = 0;
      }
      if (uVar17 < 0x4000) {
        bVar6 = (byte)(uVar17 >> 10);
      }
      uVar13 = (uVar12 * 0x811a >> 8) + uVar13;
      uVar12 = uVar13 - 0x4515;
      bVar1 = (uVar13 < 0x4515) * '\x10' - 0x10;
      if (uVar12 < 0x4000) {
        bVar1 = (byte)(uVar12 >> 6);
      }
      top_dst[uVar20 * 4 + 4] = bVar2 & 0xf0 | bVar6;
      top_dst[uVar20 * 4 + 5] = bVar1 | 0xf;
      if (bottom_y != (uint8_t *)0x0) {
        uVar7 = uVar7 + uVar8;
        uVar16 = uVar16 + uVar19;
        uVar17 = uVar7 >> 1 & 0xff;
        uVar7 = uVar7 >> 0x11;
        uVar8 = (uint)bottom_y[uVar20 * 2 + 1] * 0x4a85 >> 8;
        uVar12 = (uVar7 * 0x6625 >> 8) + uVar8;
        uVar13 = uVar12 - 0x379a;
        bVar6 = 0xf0;
        if (uVar12 < 0x379a) {
          bVar6 = 0;
        }
        bVar2 = (byte)(uVar13 >> 6);
        if (0x3fff < uVar13) {
          bVar2 = bVar6;
        }
        iVar14 = uVar8 - ((uVar7 * 0x3408 >> 8) + (uVar17 * 0x1913 >> 8));
        uVar12 = iVar14 + 0x2204;
        bVar6 = 0xf;
        if (iVar14 < -0x2204) {
          bVar6 = 0;
        }
        if (uVar12 < 0x4000) {
          bVar6 = (byte)(uVar12 >> 10);
        }
        uVar8 = (uVar17 * 0x811a >> 8) + uVar8;
        uVar12 = uVar8 - 0x4515;
        bVar1 = (uVar8 < 0x4515) * '\x10' - 0x10;
        if (uVar12 < 0x4000) {
          bVar1 = (byte)(uVar12 >> 6);
        }
        bottom_dst[uVar20 * 4 + 2] = bVar2 & 0xf0 | bVar6;
        bottom_dst[uVar20 * 4 + 3] = bVar1 | 0xf;
        uVar17 = uVar16 >> 1 & 0xff;
        uVar16 = uVar16 >> 0x11;
        uVar8 = (uint)bottom_y[uVar20 * 2 + 2] * 0x4a85 >> 8;
        uVar12 = (uVar16 * 0x6625 >> 8) + uVar8;
        uVar13 = uVar12 - 0x379a;
        bVar6 = 0xf0;
        if (uVar12 < 0x379a) {
          bVar6 = 0;
        }
        bVar2 = (byte)(uVar13 >> 6);
        if (0x3fff < uVar13) {
          bVar2 = bVar6;
        }
        iVar14 = uVar8 - ((uVar16 * 0x3408 >> 8) + (uVar17 * 0x1913 >> 8));
        uVar12 = iVar14 + 0x2204;
        bVar6 = 0xf;
        if (iVar14 < -0x2204) {
          bVar6 = 0;
        }
        if (uVar12 < 0x4000) {
          bVar6 = (byte)(uVar12 >> 10);
        }
        uVar8 = (uVar17 * 0x811a >> 8) + uVar8;
        uVar12 = uVar8 - 0x4515;
        bottom_dst[uVar20 * 4 + 4] = bVar2 & 0xf0 | bVar6;
        bVar6 = (uVar8 < 0x4515) * '\x10' - 0x10;
        if (uVar12 < 0x4000) {
          bVar6 = (byte)(uVar12 >> 6);
        }
        bottom_dst[uVar20 * 4 + 5] = bVar6 | 0xf;
      }
      uVar20 = uVar20 + 1;
      uVar8 = uVar19;
      uVar12 = uVar4;
    } while (uVar3 != uVar20);
  }
  if (((long)len & 1U) == 0) {
    uVar3 = uVar19 + uVar4 * 3 + 0x20002;
    uVar16 = uVar3 >> 2 & 0xff;
    uVar3 = uVar3 >> 0x12;
    uVar8 = (uint)top_y[lVar15] * 0x4a85 >> 8;
    uVar12 = (uVar3 * 0x6625 >> 8) + uVar8;
    bVar2 = 0;
    uVar13 = uVar12 - 0x379a;
    bVar6 = 0xf0;
    if (uVar12 < 0x379a) {
      bVar6 = bVar2;
    }
    bVar1 = (byte)(uVar13 >> 6);
    if (0x3fff < uVar13) {
      bVar1 = bVar6;
    }
    iVar14 = (uVar3 * 0x3408 >> 8) + (uVar16 * 0x1913 >> 8);
    uVar3 = (uVar8 - iVar14) + 0x2204;
    bVar6 = 0xf;
    if ((int)(uVar8 - iVar14) < -0x2204) {
      bVar6 = bVar2;
    }
    if (uVar3 < 0x4000) {
      bVar6 = (byte)(uVar3 >> 10);
    }
    uVar8 = (uVar16 * 0x811a >> 8) + uVar8;
    uVar3 = uVar8 - 0x4515;
    bVar11 = (uVar8 < 0x4515) * '\x10' - 0x10;
    if (uVar3 < 0x4000) {
      bVar11 = (byte)(uVar3 >> 6);
    }
    lVar5 = (long)(int)lVar15;
    top_dst[lVar5 * 2] = bVar1 & 0xf0 | bVar6;
    top_dst[lVar5 * 2 + 1] = bVar11 | 0xf;
    if (bottom_y != (uint8_t *)0x0) {
      uVar12 = uVar4 + uVar19 * 3 + 0x20002;
      uVar13 = uVar12 >> 0x12;
      uVar3 = (uint)bottom_y[lVar15] * 0x4a85 >> 8;
      uVar4 = (uVar13 * 0x6625 >> 8) + uVar3;
      uVar8 = uVar4 - 0x379a;
      bVar6 = 0xf0;
      if (uVar4 < 0x379a) {
        bVar6 = bVar2;
      }
      bVar1 = (byte)(uVar8 >> 6);
      if (0x3fff < uVar8) {
        bVar1 = bVar6;
      }
      uVar4 = uVar12 >> 2 & 0xff;
      iVar14 = (uVar13 * 0x3408 >> 8) + (uVar4 * 0x1913 >> 8);
      uVar8 = (uVar3 - iVar14) + 0x2204;
      bVar6 = 0xf;
      if ((int)(uVar3 - iVar14) < -0x2204) {
        bVar6 = bVar2;
      }
      if (uVar8 < 0x4000) {
        bVar6 = (byte)(uVar8 >> 10);
      }
      uVar3 = (uVar4 * 0x811a >> 8) + uVar3;
      uVar4 = uVar3 - 0x4515;
      bottom_dst[lVar5 * 2] = bVar1 & 0xf0 | bVar6;
      bVar6 = (uVar3 < 0x4515) * '\x10' - 0x10;
      if (uVar4 < 0x4000) {
        bVar6 = (byte)(uVar4 >> 6);
      }
      bottom_dst[lVar5 * 2 + 1] = bVar6 | 0xf;
    }
  }
  return;
}

Assistant:

static void EmptyUpsampleFunc(const uint8_t* top_y, const uint8_t* bottom_y,
                              const uint8_t* top_u, const uint8_t* top_v,
                              const uint8_t* cur_u, const uint8_t* cur_v,
                              uint8_t* top_dst, uint8_t* bottom_dst, int len) {
  (void)top_y;
  (void)bottom_y;
  (void)top_u;
  (void)top_v;
  (void)cur_u;
  (void)cur_v;
  (void)top_dst;
  (void)bottom_dst;
  (void)len;
  assert(0);   // COLORSPACE SUPPORT NOT COMPILED
}